

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib506.c
# Opt level: O0

void my_unlock(CURL *handle,curl_lock_data data,void *useptr)

{
  int local_34;
  int locknum;
  userdata *user;
  char *what;
  void *useptr_local;
  curl_lock_data data_local;
  CURL *handle_local;
  
  if (data == CURL_LOCK_DATA_SHARE) {
    user = (userdata *)anon_var_dwarf_33f;
    local_34 = 0;
  }
  else if (data == CURL_LOCK_DATA_COOKIE) {
    user = (userdata *)anon_var_dwarf_353;
    local_34 = 2;
  }
  else {
    if (data != CURL_LOCK_DATA_DNS) {
      curl_mfprintf(_stderr,"unlock: no such data: %d\n",data);
      return;
    }
    user = (userdata *)anon_var_dwarf_349;
    local_34 = 1;
  }
  if (locks[local_34] == 0) {
    curl_mprintf("unlock: double unlocked %s\n",user);
  }
  else {
    locks[local_34] = locks[local_34] + -1;
    curl_mprintf("unlock: %-6s [%s]: %d\n",user,*useptr,*(undefined4 *)((long)useptr + 8));
    *(int *)((long)useptr + 8) = *(int *)((long)useptr + 8) + 1;
  }
  return;
}

Assistant:

static void my_unlock(CURL *handle, curl_lock_data data, void *useptr)
{
  const char *what;
  struct userdata *user = (struct userdata *)useptr;
  int locknum;
  (void)handle;
  switch(data) {
    case CURL_LOCK_DATA_SHARE:
      what = "share";
      locknum = 0;
      break;
    case CURL_LOCK_DATA_DNS:
      what = "dns";
      locknum = 1;
      break;
    case CURL_LOCK_DATA_COOKIE:
      what = "cookie";
      locknum = 2;
      break;
    default:
      fprintf(stderr, "unlock: no such data: %d\n", (int)data);
      return;
  }

  /* detect unlocking of unlocked locks */
  if(!locks[locknum]) {
    printf("unlock: double unlocked %s\n", what);
    return;
  }
  locks[locknum]--;

  printf("unlock: %-6s [%s]: %d\n", what, user->text, user->counter);
  user->counter++;
}